

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

NTRUEncodeSchedule * ntru_encode_pubkey_schedule(uint p,uint q)

{
  uint16_t *ms_in;
  NTRUEncodeSchedule *pNVar1;
  NTRUEncodeSchedule *sched;
  size_t i;
  uint16_t *ms;
  uint q_local;
  uint p_local;
  
  ms_in = (uint16_t *)safemalloc((ulong)p,2,0);
  for (sched = (NTRUEncodeSchedule *)0x0; sched < (NTRUEncodeSchedule *)(ulong)p;
      sched = (NTRUEncodeSchedule *)((long)&sched->nvals + 1)) {
    ms_in[(long)sched] = (uint16_t)q;
  }
  pNVar1 = ntru_encode_schedule(ms_in,(ulong)p);
  safefree(ms_in);
  return pNVar1;
}

Assistant:

static NTRUEncodeSchedule *ntru_encode_pubkey_schedule(unsigned p, unsigned q)
{
    uint16_t *ms = snewn(p, uint16_t);
    for (size_t i = 0; i < p; i++)
        ms[i] = q;
    NTRUEncodeSchedule *sched = ntru_encode_schedule(ms, p);
    sfree(ms);
    return sched;
}